

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O0

int choose(void)

{
  __type _Var1;
  bool bVar2;
  _Setw _Var3;
  int num;
  ostream *poVar4;
  string local_38 [8];
  string input;
  int local_14;
  int a;
  int ok;
  int i;
  int choice;
  
  local_14 = 0;
  std::__cxx11::string::string(local_38);
  std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_left);
  do {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Below are the items on sale:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    for (a = 0; a < 5; a = a + 1) {
      _Var3 = std::setw(10);
      poVar4 = std::operator<<((ostream *)&std::cout,_Var3);
      poVar4 = std::operator<<(poVar4,(string *)(ITEM + a));
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,ITEM[a].price);
      poVar4 = std::operator<<(poVar4," yuan");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Please choose the item.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_38);
    for (a = 0; a < 5; a = a + 1) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,&ITEM[a].name);
      if (_Var1) {
        bVar2 = check(a);
        if (bVar2) {
          ok = a;
          local_14 = 1;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "-------------------------------------------------------------------------"
                                  );
          poVar4 = (ostream *)
                   std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::cout,"Sorry! The item chosen is overdued!");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_14 = -1;
        }
        break;
      }
    }
    if (local_14 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------------------------"
                              );
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "I don\'t have what you want,please input again.");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    if (local_14 == 1) {
      num = amount();
      if (ITEM[a].amount < num) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "-------------------------------------------------------------------------"
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)(ITEM + a));
        poVar4 = std::operator<<(poVar4,"Sorry! Not enough items left!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"back");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        buttonback();
      }
      else {
        pay(ok,num,income);
      }
      std::__cxx11::string::~string(local_38);
      return ok;
    }
  } while( true );
}

Assistant:

int choose() {
    int choice, i, ok = 0, a;
    string input;
    cout.flags(ios::left);

    do {
        frame
        cout << "Below are the items on sale:" << endl;
        for (i = 0; i < number; i++) {
            cout << setw(10) << ITEM[i].name << ITEM[i].price << " yuan" << endl;
        }
        cout << endl;
        cout << "Please choose the item." << endl;
        frame
        cin >> input;
        for (i = 0; i < number; i++) {
            if (input == ITEM[i].name) {
                if (check(i)) {
                    choice = i;
                    ok = 1;
                    break;
                } else {
                    frame
                    cout << "Sorry! The item chosen is overdued!" << endl;
                    ok = -1;
                    break;
                }
            }
        }
        if (ok == 0) {
            frame
            cout << "I don't have what you want,please input again." << endl << endl;
            continue;
        }
    } while (ok != 1);
    a = amount();
    if (ITEM[i].amount < a) {
        frame
        cout << ITEM[i].name << "Sorry! Not enough items left!" << endl;
        cout << endl << endl << endl << "back" << endl;
        buttonback();
    } else {
        pay(choice, a, income);
    }

    return choice;
}